

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O1

int parse_tcp(void *data,char **str,int inv)

{
  bool bVar1;
  uint8_t uVar2;
  int iVar3;
  char *str_00;
  char *pcVar4;
  byte bVar5;
  double __x;
  double __x_00;
  
  pcVar4 = *str;
  str_00 = strtok((char *)0x0," \t\n");
  if (str_00 == (char *)0x0) {
    _log(__x);
    return -1;
  }
  iVar3 = strcmp(pcVar4,"--sport");
  if (iVar3 == 0) {
    iVar3 = parse_port(str_00,(uint16_t *)data);
    if (iVar3 != 0) {
      return -1;
    }
    bVar1 = true;
    bVar5 = 1;
  }
  else {
    iVar3 = strcmp(pcVar4,"--dport");
    if (iVar3 == 0) {
      iVar3 = parse_port(str_00,(uint16_t *)((long)data + 4));
      if (iVar3 != 0) {
        return -1;
      }
      bVar5 = 2;
    }
    else {
      iVar3 = strcmp(pcVar4,"--tcp-flags");
      bVar1 = false;
      bVar5 = 0;
      if (iVar3 != 0) goto LAB_00104d8d;
      pcVar4 = strtok((char *)0x0," \t\n");
      if (pcVar4 == (char *)0x0) {
        _log(__x_00);
        return -1;
      }
      uVar2 = parse_tcp_flag(pcVar4);
      *(uint8_t *)((long)data + 9) = uVar2;
      uVar2 = parse_tcp_flag(str_00);
      *(uint8_t *)((long)data + 10) = uVar2;
      bVar5 = 8;
    }
    bVar1 = true;
  }
LAB_00104d8d:
  if (bVar1 && inv != 0) {
    *(byte *)((long)data + 0xb) = *(byte *)((long)data + 0xb) | bVar5;
  }
  return 0;
}

Assistant:

static int parse_tcp(void *data, char **str, int inv)
{
	match_tcp_t *m = (match_tcp_t *)data;
	int inv_type = 0;
	char *p = *str;
	char *q = p;
	char *r = NULL;
	q = strtok(NULL, " \t\n");

	if (q == NULL) {
		log_err("opt \"%s\" arg is null", p);
		goto err;
	}

	if (strcmp(p, "--sport") == 0) {
		if (parse_port(q, m->src) != 0) {
			goto err;
		}

		inv_type = INV_TCP_SRC;
	} else if (strcmp(p, "--dport") == 0) {
		if (parse_port(q, m->dst) != 0) {
			goto err;
		}

		inv_type = INV_TCP_DST;
	} else if (strcmp(p, "--tcp-flags") == 0) {
		r = strtok(NULL, " \t\n");

		if (r == NULL) {
			log_err("opt --tcp-flags requires two args\n");
			goto err;
		}

		m->flag = parse_tcp_flag(r);
		m->flag_mask = parse_tcp_flag(q);
		q = r;
		inv_type = INV_TCP_FLAG;
	} else if (strcmp(p, "--tcp-option") == 0) {
		//TODO:
	}

	if (inv && inv_type) {
		m->invert |= inv_type;
	}

	p = q;
	return 0;
err:
	return -1;
}